

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansequence.c
# Opt level: O1

void print_usage(char *prg)

{
  fprintf(_stderr,
          "Usage: %s [<can-interface>] [Options]\n\ncansequence sends CAN messages with a rising sequence number as payload.\nWhen the -r option is given, cansequence expects to receive these messages\nand prints an error message if a wrong sequence number is encountered.\nThe main purpose of this program is to test the reliability of CAN links.\n\nOptions:\n -e, --extended       send/receive extended frames\n -f, --canfd          send/receive CAN-FD CAN frames\n -s, --strict         refuse classical CAN frames in CAN-FD mode\n -b, --brs            send CAN-FD CAN frames with bitrate switch (BRS)\n -i, --identifier=ID  CAN Identifier (default = %u)\n     --loop=COUNT     send message COUNT times\n -p, --poll           use poll(2) to wait for buffer space while sending\n -q, --quit <num>     quit if <num> wrong sequences are encountered\n -r, --receive        work as receiver\n -v, --verbose        be verbose (twice to be even more verbose\n -h, --help           this help\n"
          ,prg,2);
  return;
}

Assistant:

static void print_usage(char *prg)
{
	fprintf(stderr,
		"Usage: %s [<can-interface>] [Options]\n"
		"\n"
		"cansequence sends CAN messages with a rising sequence number as payload.\n"
		"When the -r option is given, cansequence expects to receive these messages\n"
		"and prints an error message if a wrong sequence number is encountered.\n"
		"The main purpose of this program is to test the reliability of CAN links.\n"
		"\n"
		"Options:\n"
		" -e, --extended       send/receive extended frames\n"
		" -f, --canfd          send/receive CAN-FD CAN frames\n"
		" -s, --strict         refuse classical CAN frames in CAN-FD mode\n"
		" -b, --brs            send CAN-FD CAN frames with bitrate switch (BRS)\n"
		" -i, --identifier=ID  CAN Identifier (default = %u)\n"
		"     --loop=COUNT     send message COUNT times\n"
		" -p, --poll           use poll(2) to wait for buffer space while sending\n"
		" -q, --quit <num>     quit if <num> wrong sequences are encountered\n"
		" -r, --receive        work as receiver\n"
		" -v, --verbose        be verbose (twice to be even more verbose\n"
		" -h, --help           this help\n",
		prg, CAN_ID_DEFAULT);
}